

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandDch(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  Dch_Pars_t Pars;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  Dch_ManSetDefaultParams(&Pars);
  Extra_UtilGetoptReset();
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"WCSsptgcfrvh");
    iVar4 = globalUtilOptind;
    switch(iVar1) {
    case 99:
      Pars.fUseCSat = Pars.fUseCSat ^ 1;
      break;
    case 100:
    case 0x65:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x71:
    case 0x75:
      goto switchD_0022f1db_caseD_64;
    case 0x66:
      Pars.fLightSynth = Pars.fLightSynth ^ 1;
      break;
    case 0x67:
      Pars.fUseGia = Pars.fUseGia ^ 1;
      break;
    case 0x70:
      Pars.fPower = Pars.fPower ^ 1;
      break;
    case 0x72:
      Pars.fSkipRedSupp = Pars.fSkipRedSupp ^ 1;
      break;
    case 0x73:
      Pars.fSynthesis = Pars.fSynthesis ^ 1;
      break;
    case 0x74:
      Pars.fSimulateTfo = Pars.fSimulateTfo ^ 1;
      break;
    case 0x76:
      Pars.fVerbose = Pars.fVerbose ^ 1;
      break;
    default:
      if (iVar1 == 0x43) {
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0022f2db:
          Abc_Print(-1,pcVar3);
          goto switchD_0022f1db_caseD_64;
        }
        iVar1 = atoi(argv[globalUtilOptind]);
        Pars.nBTLimit = iVar1;
      }
      else if (iVar1 == 0x53) {
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-S\" should be followed by an integer.\n";
          goto LAB_0022f2db;
        }
        iVar1 = atoi(argv[globalUtilOptind]);
        Pars.nSatVarMax = iVar1;
      }
      else {
        if (iVar1 != 0x57) {
          if (iVar1 == -1) {
            if (pAVar2 == (Abc_Ntk_t *)0x0) {
              pcVar3 = "Empty network.\n";
            }
            else {
              if (pAVar2->ntkType == ABC_NTK_STRASH) {
                pAVar2 = Abc_NtkDch(pAVar2,&Pars);
                if (pAVar2 != (Abc_Ntk_t *)0x0) {
                  Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
                  return 0;
                }
                Abc_Print(-1,"Command has failed.\n");
                return 0;
              }
              pcVar3 = "This command works only for strashed networks.\n";
            }
            iVar4 = -1;
            goto LAB_0022f43b;
          }
          goto switchD_0022f1db_caseD_64;
        }
        if (argc <= globalUtilOptind) {
          pcVar3 = "Command line switch \"-W\" should be followed by an integer.\n";
          goto LAB_0022f2db;
        }
        iVar1 = atoi(argv[globalUtilOptind]);
        Pars.nWords = iVar1;
      }
      globalUtilOptind = iVar4 + 1;
      if (iVar1 < 0) {
switchD_0022f1db_caseD_64:
        iVar4 = -2;
        Abc_Print(-2,"usage: dch [-WCS num] [-sptgcfrvh]\n");
        Abc_Print(-2,"\t         computes structural choices using a new approach\n");
        Abc_Print(-2,"\t-W num : the max number of simulation words [default = %d]\n",
                  (ulong)(uint)Pars.nWords);
        Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                  (ulong)(uint)Pars.nBTLimit);
        Abc_Print(-2,"\t-S num : the max number of SAT variables [default = %d]\n",
                  (ulong)(uint)Pars.nSatVarMax);
        pcVar5 = "yes";
        pcVar3 = "yes";
        if (Pars.fSynthesis == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-s     : toggle synthesizing three snapshots [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (Pars.fPower == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-p     : toggle power-aware rewriting [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (Pars.fSimulateTfo == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-t     : toggle simulation of the TFO classes [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (Pars.fUseGia == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-g     : toggle using GIA to prove equivalences [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (Pars.fUseCSat == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-c     : toggle using circuit-based SAT vs. MiniSat [default = %s]\n",pcVar3
                 );
        pcVar3 = "yes";
        if (Pars.fLightSynth == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-f     : toggle using faster logic synthesis [default = %s]\n",pcVar3);
        pcVar3 = "yes";
        if (Pars.fSkipRedSupp == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-r     : toggle skipping choices with redundant support [default = %s]\n",
                  pcVar3);
        if (Pars.fVerbose == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar5);
        pcVar3 = "\t-h     : print the command usage\n";
LAB_0022f43b:
        Abc_Print(iVar4,pcVar3);
        return 1;
      }
    }
  } while( true );
}

Assistant:

int Abc_CommandDch( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Dch_Pars_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c;
    extern Abc_Ntk_t * Abc_NtkDch( Abc_Ntk_t * pNtk, Dch_Pars_t * pPars );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Dch_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WCSsptgcfrvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nSatVarMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nSatVarMax < 0 )
                goto usage;
            break;
        case 's':
            pPars->fSynthesis ^= 1;
            break;
        case 'p':
            pPars->fPower ^= 1;
            break;
        case 't':
            pPars->fSimulateTfo ^= 1;
            break;
        case 'g':
            pPars->fUseGia ^= 1;
            break;
        case 'c':
            pPars->fUseCSat ^= 1;
            break;
        case 'f':
            pPars->fLightSynth ^= 1;
            break;
        case 'r':
            pPars->fSkipRedSupp ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }
    pNtkRes = Abc_NtkDch( pNtk, pPars );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: dch [-WCS num] [-sptgcfrvh]\n" );
    Abc_Print( -2, "\t         computes structural choices using a new approach\n" );
    Abc_Print( -2, "\t-W num : the max number of simulation words [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-S num : the max number of SAT variables [default = %d]\n", pPars->nSatVarMax );
    Abc_Print( -2, "\t-s     : toggle synthesizing three snapshots [default = %s]\n", pPars->fSynthesis? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle power-aware rewriting [default = %s]\n", pPars->fPower? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle simulation of the TFO classes [default = %s]\n", pPars->fSimulateTfo? "yes": "no" );
    Abc_Print( -2, "\t-g     : toggle using GIA to prove equivalences [default = %s]\n", pPars->fUseGia? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle using circuit-based SAT vs. MiniSat [default = %s]\n", pPars->fUseCSat? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle using faster logic synthesis [default = %s]\n", pPars->fLightSynth? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle skipping choices with redundant support [default = %s]\n", pPars->fSkipRedSupp? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}